

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idruptracer.cpp
# Opt level: O2

void __thiscall CaDiCaL::IdrupTracer::put_binary_id(IdrupTracer *this,uint64_t id)

{
  for (; 0x7f < id; id = id >> 7) {
    File::put(this->file,(byte)id | 0x80);
  }
  File::put(this->file,(byte)id);
  return;
}

Assistant:

inline void IdrupTracer::put_binary_id (uint64_t id) {
  assert (binary);
  assert (file);
  uint64_t x = id;
  unsigned char ch;
  while (x & ~0x7f) {
    ch = (x & 0x7f) | 0x80;
    file->put (ch);
    x >>= 7;
  }
  ch = x;
  file->put (ch);
}